

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O1

ztast_program_t * ztast_program(ztast_t *ast,ztast_statement_t *statements)

{
  ztast_program_t *pzVar1;
  
  pzVar1 = (ztast_program_t *)(*ast->mallocfn)(8,ast->opaque);
  if (pzVar1 == (ztast_program_t *)0x0) {
    pzVar1 = (ztast_program_t *)0x0;
  }
  else {
    pzVar1->statements = statements;
    ast->program = pzVar1;
  }
  return pzVar1;
}

Assistant:

ztast_program_t *ztast_program(ztast_t *ast, ztast_statement_t *statements)
{
  ztast_program_t *program;

  assert(ast);
  /* statement may be NULL */

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_program\n");
#endif

  program = ZTAST_MALLOC(sizeof(*program));
  if (program == NULL)
    return NULL;

  program->statements = statements;

  /* Store the initial program pointer in ast_t.
   * This is here because it's awkward to do in the parser. */
  assert(ast->program == NULL);
  ast->program = program;

  return program;
}